

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

int CVmObjFile::s_getp_getRootName(vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  undefined4 extraout_var;
  char *pcVar3;
  char *__s;
  size_t bytelen;
  char buf [8192];
  char acStack_2028 [8200];
  
  if (s_getp_getRootName(vm_val_t*,unsigned_int*)::desc == '\0') {
    s_getp_getRootName();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&s_getp_getRootName::desc);
  if (iVar1 == 0) {
    CVmBif::pop_fname_val(acStack_2028,0x2000);
    iVar1 = CVmNetFile::open(acStack_2028,0,0,0xb,0);
    if (((CVmNetFile *)CONCAT44(extraout_var,iVar1))->srvfname == (char *)0x0) {
      __s = os_get_root_name(acStack_2028);
    }
    else {
      pcVar3 = strrchr(acStack_2028,0x2f);
      __s = pcVar3 + 1;
      if (pcVar3 == (char *)0x0) {
        __s = acStack_2028;
      }
    }
    CVmNetFile::abandon((CVmNetFile *)CONCAT44(extraout_var,iVar1));
    bytelen = strlen(__s);
    vVar2 = CVmObjString::create(0,__s,bytelen);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar2;
  }
  return 1;
}

Assistant:

int CVmObjFile::s_getp_getRootName(VMG_ vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(1);
    char buf[OSFNMAX*2];
    const char *ret;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string argument into our buffer */
    CVmBif::pop_fname_val(vmg_ buf, sizeof(buf));

    /* set up a no-access file descriptor to determine where the file is */
    CVmNetFile *nf = CVmNetFile::open(vmg_ buf, 0, 0, OSFTUNK, 0);

    /*
     *   If the file is on the network storage server, we always use the Unix
     *   convention, regardless of the local naming rules.  Otherwise, use
     *   the local OS API to get the root name.  
     */
    if (nf->is_net_file())
    {
        /* 
         *   We're in network mode, so use the Unix path conventions.  Simply
         *   scan for the last '/' character; if we find it, the root name is
         *   the part after the '/', otherwise it's the whole string.  
         */
        const char *sl = strrchr(buf, '/');
        ret = (sl != 0 ? sl + 1 : buf);
    }
    else
    {
        /* it's not a network file - use the local filename rules */
        ret = os_get_root_name(buf);
    }

    /* done with the net file desriptor */
    nf->abandon(vmg0_);

    /* return the string */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, ret, strlen(ret)));

    /* handled */
    return TRUE;
}